

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

void __thiscall miniros::Subscription::dropAllConnections(Subscription *this)

{
  bool bVar1;
  iterator this_00;
  element_type *peVar2;
  __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
  *in_RDI;
  iterator end;
  iterator it;
  scoped_lock<std::mutex> lock;
  V_PublisherLink localsubscribers;
  mutex_type *in_stack_ffffffffffffffa8;
  vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
  in_stack_ffffffffffffffc0;
  
  std::
  vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ::vector((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
            *)0x4d024d);
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_RDI,in_stack_ffffffffffffffa8);
  std::
  vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ::swap((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
          *)in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8);
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d0285);
  this_00 = std::
            vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
            ::begin((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                     *)in_stack_ffffffffffffffa8);
  std::
  vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ::end((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
         *)in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                               *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                 *)&stack0xffffffffffffffc0);
    peVar2 = std::
             __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4d02ca);
    (*peVar2->_vptr_PublisherLink[5])();
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                  *)&stack0xffffffffffffffc0);
  }
  std::
  vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ::~vector((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
             *)this_00._M_current);
  return;
}

Assistant:

void Subscription::dropAllConnections()
{
  // Swap our subscribers list with a local one so we can only lock for a short period of time, because a
  // side effect of our calling drop() on connections can be re-locking the subscribers mutex
  V_PublisherLink localsubscribers;

  {
    std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

    localsubscribers.swap(publisher_links_);
  }

  V_PublisherLink::iterator it = localsubscribers.begin();
  V_PublisherLink::iterator end = localsubscribers.end();
  for (;it != end; ++it)
  {
    (*it)->drop();
  }
}